

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aligned.h
# Opt level: O2

AlignedVector<float> * __thiscall
intgemm::AlignedVector<float>::operator=(AlignedVector<float> *this,AlignedVector<float> *from)

{
  if (this != from) {
    release(this);
    this->mem_ = from->mem_;
    this->size_ = from->size_;
    from->mem_ = (float *)0x0;
    from->size_ = 0;
  }
  return this;
}

Assistant:

AlignedVector &operator=(AlignedVector &&from) {
      if (this == &from) return *this;
      release();
      mem_ = from.mem_;
      size_ = from.size_;
      from.mem_ = nullptr;
      from.size_ = 0;
      return *this;
    }